

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunContext::resetAssertionInfo(RunContext *this)

{
  char *pcVar1;
  
  pcVar1 = (this->m_lastAssertionInfo).macroName.m_data;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  (this->m_lastAssertionInfo).macroName.m_start = "";
  (this->m_lastAssertionInfo).macroName.m_size = 0;
  (this->m_lastAssertionInfo).macroName.m_data = (char *)0x0;
  pcVar1 = (this->m_lastAssertionInfo).capturedExpression.m_data;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  (this->m_lastAssertionInfo).capturedExpression.m_data = (char *)0x0;
  (this->m_lastAssertionInfo).capturedExpression.m_start =
       "{Unknown expression after the reported line}";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0x2c;
  return;
}

Assistant:

void RunContext::resetAssertionInfo() {
        m_lastAssertionInfo.macroName = StringRef();
        m_lastAssertionInfo.capturedExpression = "{Unknown expression after the reported line}"_sr;
    }